

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

size_t asio::detail::
       write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                 (basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *s,mutable_buffers_1 *buffers,undefined8 param_3,error_code *param_4)

{
  bool bVar1;
  size_t sVar2;
  const_buffer local_70;
  size_t local_60;
  size_t max_size;
  consuming_buffers<asio::const_buffer,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*> tmp;
  error_category *local_38;
  error_code *ec_local;
  mutable_buffer **param_2_local;
  mutable_buffers_1 *buffers_local;
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s_local;
  
  std::error_code::error_code
            ((error_code *)&tmp.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_
            );
  *(size_t *)param_4 = tmp.super_consuming_single_buffer<asio::const_buffers_1>.total_consumed_;
  param_4->_M_cat = local_38;
  consuming_buffers<asio::const_buffer,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*>::
  consuming_buffers((consuming_buffers<asio::const_buffer,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*>
                     *)&max_size,buffers);
  while (bVar1 = consuming_single_buffer<asio::const_buffers_1>::empty
                           ((consuming_single_buffer<asio::const_buffers_1> *)&max_size),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    sVar2 = consuming_single_buffer<asio::const_buffers_1>::total_consumed
                      ((consuming_single_buffer<asio::const_buffers_1> *)&max_size);
    sVar2 = transfer_all_t::operator()((transfer_all_t *)((long)&s_local + 7),param_4,sVar2);
    local_60 = adapt_completion_condition_result(sVar2);
    if (local_60 == 0) break;
    local_70 = (const_buffer)
               consuming_single_buffer<asio::const_buffers_1>::prepare
                         ((consuming_single_buffer<asio::const_buffers_1> *)&max_size,local_60);
    sVar2 = basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::write_some<asio::const_buffers_1>(s,(const_buffers_1 *)&local_70,param_4);
    consuming_single_buffer<asio::const_buffers_1>::consume
              ((consuming_single_buffer<asio::const_buffers_1> *)&max_size,sVar2);
  }
  sVar2 = consuming_single_buffer<asio::const_buffers_1>::total_consumed
                    ((consuming_single_buffer<asio::const_buffers_1> *)&max_size);
  return sVar2;
}

Assistant:

std::size_t write_buffer_sequence(SyncWriteStream& s,
      const ConstBufferSequence& buffers, const ConstBufferIterator&,
      CompletionCondition completion_condition, asio::error_code& ec)
  {
    ec = asio::error_code();
    asio::detail::consuming_buffers<const_buffer,
        ConstBufferSequence, ConstBufferIterator> tmp(buffers);
    while (!tmp.empty())
    {
      if (std::size_t max_size = detail::adapt_completion_condition_result(
            completion_condition(ec, tmp.total_consumed())))
        tmp.consume(s.write_some(tmp.prepare(max_size), ec));
      else
        break;
    }
    return tmp.total_consumed();;
  }